

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

pair<bool,_std::pair<imrt::Station_*,_int>_> * __thiscall
imrt::ApertureILS::getLSBeamlet(ApertureILS *this,Plan *P)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  pointer ppVar5;
  ostream *poVar6;
  void *this_00;
  size_type sVar7;
  pair<bool,_std::pair<imrt::Station_*,_int>_> *in_RDI;
  pair<imrt::Station_*,_int> pVar8;
  int i;
  bool sign;
  int beamlet;
  int addit;
  iterator it;
  Station *s;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
  *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  Station *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  _Self local_108;
  Station *local_100;
  int local_f8;
  undefined4 local_ec;
  Station *local_e8;
  int local_e0;
  undefined1 local_d5;
  int local_d4;
  Station *local_d0;
  int local_c8;
  undefined4 local_bc;
  Station *local_b8;
  int local_b0;
  undefined1 local_a2;
  byte local_a1;
  int local_a0;
  undefined4 local_9c;
  _Self local_98;
  undefined4 local_8c;
  Station *local_88;
  int local_80;
  undefined4 local_64;
  Station *local_60;
  int local_58;
  undefined1 local_49;
  Station *local_48;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  Plan::best_beamlets((Plan *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),(int)in_stack_fffffffffffffe30
                      ,in_stack_fffffffffffffe2c);
  sVar4 = std::
          set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
          ::size((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                  *)0x16afb2);
  if (sVar4 == 0) {
    local_49 = 0;
    local_64 = 0xffffffff;
    pVar8 = std::make_pair<imrt::Station*&,int>
                      ((Station **)in_stack_fffffffffffffe30,
                       (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_88 = pVar8.first;
    local_80 = pVar8.second;
    local_60 = local_88;
    local_58 = local_80;
    std::make_pair<bool,std::pair<imrt::Station*,int>>
              ((bool *)in_stack_fffffffffffffe30,
               (pair<imrt::Station_*,_int> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  }
  else {
    local_98._M_node =
         (_Base_ptr)
         std::
         set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
         ::begin((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    iVar2 = rand();
    sVar4 = std::
            set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
            ::size((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                    *)0x16b0b6);
    local_9c = (undefined4)((ulong)(long)iVar2 % sVar4);
    std::
    advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,int>
              ((_Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),iVar3);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
             ::operator->(in_stack_fffffffffffffe30);
    local_48 = (ppVar5->second).first;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
             ::operator->(in_stack_fffffffffffffe30);
    local_a0 = (ppVar5->second).second;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
             ::operator->(in_stack_fffffffffffffe30);
    local_a1 = (ppVar5->first).second & 1;
    bVar1 = Station::isActiveBeamlet
                      ((Station *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    if (bVar1) {
      local_d4 = 0;
      while( true ) {
        bVar1 = isBeamletModifiable((ApertureILS *)
                                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                    (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                                    in_stack_fffffffffffffe58,
                                    SUB41((uint)in_stack_fffffffffffffe54 >> 0x18,0));
        in_stack_fffffffffffffe50 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe50);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_d4 = local_d4 + 1;
        sVar4 = (size_type)local_d4;
        sVar7 = std::
                set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                ::size((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                        *)0x16b2e5);
        if (sVar4 == sVar7) {
          local_d5 = 0;
          local_ec = 0xffffffff;
          pVar8 = std::make_pair<imrt::Station*&,int>
                            ((Station **)in_stack_fffffffffffffe30,
                             (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          local_100 = pVar8.first;
          local_f8 = pVar8.second;
          local_e8 = local_100;
          local_e0 = local_f8;
          std::make_pair<bool,std::pair<imrt::Station*,int>>
                    ((bool *)in_stack_fffffffffffffe30,
                     (pair<imrt::Station_*,_int> *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          goto LAB_0016b4c5;
        }
        std::
        advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,int>
                  ((_Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (int)(sVar4 >> 0x20));
        local_108._M_node =
             (_Base_ptr)
             std::
             set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
             ::end((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        bVar1 = std::operator==(&local_98,&local_108);
        if (bVar1) {
          local_98._M_node =
               (_Base_ptr)
               std::
               set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
               ::begin((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        }
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                 ::operator->(in_stack_fffffffffffffe30);
        local_48 = (ppVar5->second).first;
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                 ::operator->(in_stack_fffffffffffffe30);
        local_a0 = (ppVar5->second).second;
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                 ::operator->(in_stack_fffffffffffffe30);
        local_a1 = (ppVar5->first).second & 1;
      }
      pVar8 = std::make_pair<imrt::Station*&,int&>
                        ((Station **)in_stack_fffffffffffffe30,
                         (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      std::make_pair<bool&,std::pair<imrt::Station*,int>>
                ((bool *)pVar8.first,
                 (pair<imrt::Station_*,_int> *)CONCAT44(pVar8.second,in_stack_fffffffffffffe28));
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"ERROR!: Beamlet ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_a0);
      poVar6 = std::operator<<(poVar6," not active in station");
      iVar3 = Station::getAngle(local_48);
      this_00 = (void *)std::ostream::operator<<(poVar6,iVar3);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_a2 = 0;
      local_bc = 0xffffffff;
      pVar8 = std::make_pair<imrt::Station*&,int>
                        ((Station **)in_stack_fffffffffffffe30,
                         (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      local_d0 = pVar8.first;
      local_c8 = pVar8.second;
      local_b8 = local_d0;
      local_b0 = local_c8;
      std::make_pair<bool,std::pair<imrt::Station*,int>>
                ((bool *)in_stack_fffffffffffffe30,
                 (pair<imrt::Station_*,_int> *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
  }
LAB_0016b4c5:
  local_8c = 1;
  std::
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  ::~set((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
          *)0x16b4d2);
  return in_RDI;
}

Assistant:

pair <bool, pair<Station*, int> > ApertureILS::getLSBeamlet(Plan& P){
  auto sb = P.best_beamlets(bsize, vsize);
  Station* s;
  if (sb.size() < 1) return(make_pair(false, make_pair(s,-1))); 

  auto it = sb.begin();
  int addit = rand()%sb.size();
  std::advance(it,addit);

  s = it->second.first; 
  int beamlet = it->second.second;
  bool sign = it->first.second; 
  
  if (!s->isActiveBeamlet(beamlet)){ 
    cout<< "ERROR!: Beamlet "<< beamlet << " not active in station" << s->getAngle()  << endl;
    return(make_pair(false, make_pair(s,-1)));
  }

  int i=0;
  while (!isBeamletModifiable(beamlet, s, !sign)) {
    // If no beamlet was found return -1
    i++;
    if (i==sb.size()) {
      return(make_pair(false, make_pair(s,-1)));
    }
    std::advance(it,1);
    if (it==sb.end()) it = sb.begin();

    s = it->second.first; 
    beamlet = it->second.second;
    sign = it->first.second; 
  }
  return(make_pair(sign, make_pair(s,beamlet)));
}